

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_2d_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  uint16_t *puVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint16_t *puVar11;
  short *psVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  short *psVar16;
  ulong uVar17;
  int iVar18;
  uint16_t uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int local_8ba0;
  short *local_8b98;
  ulong local_8b88;
  uint local_8b58;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  uVar14 = (h + (uint)uVar1) - 1;
  iVar8 = (uVar1 >> 1) - 1;
  lVar21 = (long)w;
  bVar7 = (byte)conv_params->round_0;
  if (0 < (int)uVar14) {
    uVar2 = filter_params_x->taps;
    piVar3 = filter_params_x->filter_ptr;
    iVar22 = 1 << ((char)bd + 6U & 0x1f);
    local_8ba0 = 1 - (uint)(uVar2 >> 1);
    local_8b88 = 0;
    do {
      if (0 < w) {
        uVar15 = 0;
        iVar13 = local_8ba0;
        do {
          iVar18 = iVar22;
          if (uVar2 != 0) {
            uVar20 = 0;
            do {
              iVar18 = iVar18 + (uint)src[((long)iVar13 + uVar20) - (long)(iVar8 * src_stride)] *
                                (int)*(short *)((long)piVar3 +
                                               uVar20 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar20 = uVar20 + 1;
            } while ((uint)uVar2 != uVar20);
          }
          asStack_8b38[uVar15 + local_8b88 * lVar21] =
               (short)(iVar18 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f));
          uVar15 = uVar15 + 1;
          iVar13 = iVar13 + 1;
        } while (uVar15 != (uint)w);
      }
      local_8b88 = local_8b88 + 1;
      local_8ba0 = local_8ba0 + src_stride;
    } while (local_8b88 != uVar14);
  }
  local_8b58 = (uint)uVar1;
  if (0 < h) {
    iVar22 = conv_params->dst_stride;
    bVar5 = (byte)conv_params->round_1;
    bVar6 = ('\x0e' - bVar7) - bVar5;
    puVar4 = conv_params->dst;
    piVar3 = filter_params_y->filter_ptr;
    bVar7 = ((char)bd - bVar7) + 0xe;
    iVar13 = 1 << (bVar7 & 0x1f);
    bVar7 = bVar7 - bVar5;
    local_8b98 = asStack_8b38 + (1 - (ulong)(uint)(uVar1 >> 1)) * lVar21 + (long)(iVar8 * w);
    uVar15 = 0;
    do {
      if (0 < w) {
        iVar8 = conv_params->do_average;
        uVar20 = 0;
        psVar16 = local_8b98;
        do {
          iVar18 = iVar13;
          if ((ulong)filter_params_y->taps != 0) {
            uVar17 = 0;
            psVar12 = psVar16;
            do {
              iVar18 = iVar18 + (int)*psVar12 *
                                (int)*(short *)((long)piVar3 +
                                               uVar17 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * local_8b58 * 2));
              uVar17 = uVar17 + 1;
              psVar12 = psVar12 + lVar21;
            } while (filter_params_y->taps != uVar17);
          }
          uVar14 = iVar18 + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
          uVar19 = (uint16_t)uVar14;
          puVar11 = puVar4;
          iVar18 = iVar22;
          if (iVar8 != 0) {
            uVar9 = (uint)puVar4[uVar15 * (long)iVar22 + uVar20];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar14 = (uVar14 & 0xffff) + uVar9 >> 1;
            }
            else {
              uVar14 = (int)((uVar14 & 0xffff) * conv_params->bck_offset +
                            uVar9 * conv_params->fwd_offset) >> 4;
            }
            iVar18 = (int)(uVar14 + ((1 << (bVar6 & 0x1f)) >> 1) + (-1 << (bVar7 & 0x1f)) +
                                    (-1 << (bVar7 - 1 & 0x1f))) >> (bVar6 & 0x1f);
            if (bd == 10) {
              iVar10 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar10 = 0xfff;
            }
            else {
              iVar10 = 0xff;
            }
            if (iVar10 <= iVar18) {
              iVar18 = iVar10;
            }
            if (iVar18 < 1) {
              iVar18 = 0;
            }
            uVar19 = (uint16_t)iVar18;
            puVar11 = dst;
            iVar18 = dst_stride;
          }
          puVar11[uVar20 + (long)iVar18 * uVar15] = uVar19;
          uVar20 = uVar20 + 1;
          psVar16 = psVar16 + 1;
        } while (uVar20 != (uint)w);
      }
      uVar15 = uVar15 + 1;
      local_8b98 = local_8b98 + lVar21;
    } while (uVar15 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  int x, y, k;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (y = 0; y < im_h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      (void)bd;
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}